

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coloredpointcloud.cc
# Opt level: O2

void __thiscall
gvr::ColoredPointCloud::savePLY(ColoredPointCloud *this,char *name,bool all,ply_encoding enc)

{
  ply_encoding pVar1;
  undefined4 in_register_0000000c;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX_00;
  void *__buf_04;
  void *__buf_05;
  void *extraout_RDX_01;
  void *pvVar2;
  void *__buf_06;
  void *__buf_07;
  void *extraout_RDX_02;
  int __fd;
  string *name_00;
  long lVar3;
  int i;
  long lVar4;
  allocator local_299;
  string local_298;
  PLYWriter ply;
  
  pVar1 = enc;
  PLYWriter::PLYWriter(&ply);
  PLYWriter::open(&ply,name,enc);
  Model::setOriginToPLY((Model *)this,&ply);
  std::__cxx11::string::string((string *)&local_298,"vertex",&local_299);
  PLYWriter::addElement(&ply,&local_298,(long)(this->super_PointCloud).n);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string((string *)&local_298,"x",&local_299);
  PLYWriter::addProperty(&ply,&local_298,ply_float32);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string((string *)&local_298,"y",&local_299);
  PLYWriter::addProperty(&ply,&local_298,ply_float32);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string((string *)&local_298,"z",&local_299);
  PLYWriter::addProperty(&ply,&local_298,ply_float32);
  std::__cxx11::string::~string((string *)&local_298);
  if ((this->super_PointCloud).scanprop == (float *)0x0) {
    if (!all) goto LAB_0011b5f8;
  }
  else {
    std::__cxx11::string::string((string *)&local_298,"scan_size",&local_299);
    PLYWriter::addProperty(&ply,&local_298,ply_float32);
    std::__cxx11::string::~string((string *)&local_298);
    if (!all) goto LAB_0011b5f8;
    std::__cxx11::string::string((string *)&local_298,"scan_error",&local_299);
    PLYWriter::addProperty(&ply,&local_298,ply_float32);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::string((string *)&local_298,"scan_conf",&local_299);
    PLYWriter::addProperty(&ply,&local_298,ply_float32);
    std::__cxx11::string::~string((string *)&local_298);
  }
  if ((this->super_PointCloud).scanpos != (float *)0x0) {
    std::__cxx11::string::string((string *)&local_298,"sx",&local_299);
    PLYWriter::addProperty(&ply,&local_298,ply_float32);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::string((string *)&local_298,"sy",&local_299);
    PLYWriter::addProperty(&ply,&local_298,ply_float32);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::string((string *)&local_298,"sz",&local_299);
    PLYWriter::addProperty(&ply,&local_298,ply_float32);
    std::__cxx11::string::~string((string *)&local_298);
  }
LAB_0011b5f8:
  std::__cxx11::string::string((string *)&local_298,"diffuse_red",&local_299);
  PLYWriter::addProperty(&ply,&local_298,ply_uint8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string((string *)&local_298,"diffuse_green",&local_299);
  PLYWriter::addProperty(&ply,&local_298,ply_uint8);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::string((string *)&local_298,"diffuse_blue",&local_299);
  name_00 = &local_298;
  PLYWriter::addProperty(&ply,name_00,ply_uint8);
  std::__cxx11::string::~string((string *)&local_298);
  lVar3 = 0;
  lVar4 = 0;
  pvVar2 = extraout_RDX;
  do {
    __fd = (int)name_00;
    if ((this->super_PointCloud).n <= lVar4) {
      PLYWriter::close(&ply,__fd);
      PLYWriter::~PLYWriter(&ply);
      return;
    }
    PLYWriter::write(&ply,__fd,pvVar2,CONCAT44(in_register_0000000c,pVar1));
    PLYWriter::write(&ply,__fd,__buf,CONCAT44(in_register_0000000c,pVar1));
    PLYWriter::write(&ply,__fd,__buf_00,CONCAT44(in_register_0000000c,pVar1));
    if ((this->super_PointCloud).scanprop == (float *)0x0) {
      pvVar2 = __buf_01;
      if (all) goto LAB_0011b73a;
    }
    else {
      PLYWriter::write(&ply,__fd,__buf_01,CONCAT44(in_register_0000000c,pVar1));
      pvVar2 = __buf_02;
      if (all) {
        PLYWriter::write(&ply,__fd,__buf_02,CONCAT44(in_register_0000000c,pVar1));
        PLYWriter::write(&ply,__fd,__buf_03,CONCAT44(in_register_0000000c,pVar1));
        pvVar2 = extraout_RDX_00;
LAB_0011b73a:
        if ((this->super_PointCloud).scanpos != (float *)0x0) {
          PLYWriter::write(&ply,__fd,pvVar2,CONCAT44(in_register_0000000c,pVar1));
          PLYWriter::write(&ply,__fd,__buf_04,CONCAT44(in_register_0000000c,pVar1));
          PLYWriter::write(&ply,__fd,__buf_05,CONCAT44(in_register_0000000c,pVar1));
          pvVar2 = extraout_RDX_01;
        }
      }
    }
    PLYWriter::write(&ply,(uint)this->rgb[lVar3],pvVar2,CONCAT44(in_register_0000000c,pVar1));
    PLYWriter::write(&ply,(uint)this->rgb[lVar3 + 1],__buf_06,CONCAT44(in_register_0000000c,pVar1));
    name_00 = (string *)(ulong)this->rgb[lVar3 + 2];
    PLYWriter::write(&ply,(uint)this->rgb[lVar3 + 2],__buf_07,CONCAT44(in_register_0000000c,pVar1));
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 3;
    pvVar2 = extraout_RDX_02;
  } while( true );
}

Assistant:

void ColoredPointCloud::savePLY(const char *name, bool all, ply_encoding enc) const
{
  PLYWriter ply;

  ply.open(name, enc);

  // define header

  setOriginToPLY(ply);

  ply.addElement("vertex", getVertexCount());

  ply.addProperty("x", ply_float32);
  ply.addProperty("y", ply_float32);
  ply.addProperty("z", ply_float32);

  if (hasScanProp() != 0)
  {
    ply.addProperty("scan_size", ply_float32);

    if (all)
    {
      ply.addProperty("scan_error", ply_float32);
      ply.addProperty("scan_conf", ply_float32);
    }
  }

  if (all && hasScanPos() != 0)
  {
    ply.addProperty("sx", ply_float32);
    ply.addProperty("sy", ply_float32);
    ply.addProperty("sz", ply_float32);
  }

  ply.addProperty("diffuse_red", ply_uint8);
  ply.addProperty("diffuse_green", ply_uint8);
  ply.addProperty("diffuse_blue", ply_uint8);

  // write data

  for (int i=0; i<getVertexCount(); i++)
  {
    ply.write(getVertexComp(i, 0));
    ply.write(getVertexComp(i, 1));
    ply.write(getVertexComp(i, 2));

    if (hasScanProp() != 0)
    {
      ply.write(getScanSize(i));

      if (all)
      {
        ply.write(getScanError(i));
        ply.write(getScanConf(i));
      }
    }

    if (all && hasScanPos() != 0)
    {
      ply.write(getScanPosComp(i, 0));
      ply.write(getScanPosComp(i, 1));
      ply.write(getScanPosComp(i, 2));
    }

    ply.write(getColorComp(i, 0));
    ply.write(getColorComp(i, 1));
    ply.write(getColorComp(i, 2));
  }

  ply.close();
}